

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O3

bool TestAllRecoveryData(WirehairCodec encoder,WirehairCodec decoder,uint N,uint blockBytes,
                        uint finalBytes,uint8_t *message,uint8_t *decodedMessage,uint messageBytes)

{
  int iVar1;
  uint N_00;
  WirehairCodec decoder_00;
  bool bVar2;
  WirehairResult WVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  ostream *poVar7;
  uint uVar8;
  uint32_t Nm1Len;
  uint32_t local_54;
  ulong local_50;
  uint local_48;
  uint32_t local_44;
  WirehairCodec local_40;
  uint8_t *local_38;
  
  local_44 = 0;
  local_38 = message;
  WVar3 = wirehair_encode(encoder,N - 1,decodedMessage,blockBytes,&local_44);
  if (WVar3 == Wirehair_Success) {
    local_40 = decoder;
    if (local_44 == finalBytes) {
      WVar3 = wirehair_decode(decoder,N - 1,decodedMessage,finalBytes);
      if (WVar3 == Wirehair_NeedMore) {
        local_54 = 0;
        local_50 = (ulong)N;
        WVar3 = wirehair_encode(encoder,N,decodedMessage,blockBytes,&local_54);
        if (WVar3 == Wirehair_Success) {
          uVar8 = 2;
          local_48 = finalBytes;
          do {
            decoder_00 = local_40;
            if (local_54 != blockBytes) {
              pcVar6 = "wirehair_encode failed wrong len for N-1 and N = ";
              lVar4 = 0x31;
              goto LAB_0010372d;
            }
            iVar1 = (int)local_50;
            WVar3 = wirehair_decode(local_40,iVar1 + -2 + uVar8,decodedMessage,blockBytes);
            uVar5 = local_48;
            if (WVar3 != Wirehair_NeedMore) {
              if (WVar3 != Wirehair_Success) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"wirehair_decode failed for ",0x1b);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," and N = ",9);
                goto LAB_00103762;
              }
              N_00 = (uint)local_50;
              if (N_00 + 4 <= uVar8) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"TestAllRecoveryData: Too much overhead: ",0x28);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," extra for N=",0xd);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," Seed=n/a BlockBytes=",0x15);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
              }
              bVar2 = DoesCodecProduceOriginals
                                (decoder_00,N_00,blockBytes,uVar5,local_38,decodedMessage,
                                 messageBytes);
              if (bVar2) {
                return true;
              }
              poVar7 = (ostream *)&std::cout;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"!! Decoder2 failed to produce originals",0x27);
              lVar4 = std::cout;
              goto LAB_0010376d;
            }
            uVar5 = iVar1 + -1 + uVar8;
            uVar8 = uVar8 + 1;
            local_54 = 0;
            WVar3 = wirehair_encode(encoder,uVar5,decodedMessage,blockBytes,&local_54);
          } while (WVar3 == Wirehair_Success);
        }
        pcVar6 = "wirehair_encode failed for N = ";
        lVar4 = 0x1f;
LAB_0010372d:
        poVar7 = (ostream *)&std::cout;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
        goto LAB_00103762;
      }
      pcVar6 = "wirehair_decode failed for N-1 and N = ";
      goto LAB_001036ba;
    }
    pcVar6 = "wirehair_encode failed wrong len for N-1 and N = ";
    lVar4 = 0x31;
  }
  else {
    pcVar6 = "wirehair_encode failed for N-1 and N = ";
LAB_001036ba:
    lVar4 = 0x27;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
  poVar7 = (ostream *)&std::cout;
LAB_00103762:
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  lVar4 = *(long *)poVar7;
LAB_0010376d:
  std::ios::widen((char)*(undefined8 *)(lVar4 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return false;
}

Assistant:

static bool TestAllRecoveryData(
    WirehairCodec encoder,
    WirehairCodec decoder,
    unsigned N,
    unsigned blockBytes,
    unsigned finalBytes,
    const uint8_t* message,
    uint8_t* decodedMessage,
    unsigned messageBytes)
{
    unsigned needed = 0;

#ifdef ENABLE_ALL_RECOVERY_FINAL_BLOCK
    // Check the special case final block:
    {
        uint32_t Nm1Len = 0;
        WirehairResult encodeResult = wirehair_encode(encoder, N - 1, decodedMessage, blockBytes, &Nm1Len);

        if (encodeResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed for N-1 and N = " << N << endl;
            return false;
        }

        if (Nm1Len != finalBytes)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed wrong len for N-1 and N = " << N << endl;
            return false;
        }

        WirehairResult decodeResult = wirehair_decode(decoder, N - 1, decodedMessage, Nm1Len);

        if (decodeResult != Wirehair_NeedMore)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_decode failed for N-1 and N = " << N << endl;
            return false;
        }

        ++needed;
    }
#endif

    for (unsigned blockId = N;; ++blockId)
    {
        ++needed;

        uint32_t writeLen = 0;
        WirehairResult encodeResult = wirehair_encode(encoder, blockId, decodedMessage, blockBytes, &writeLen);

        if (encodeResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed for N = " << N << endl;
            return false;
        }

        if (writeLen != blockBytes)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed wrong len for N-1 and N = " << N << endl;
            return false;
        }

        WirehairResult decodeResult = wirehair_decode(decoder, blockId, decodedMessage, writeLen);

        if (decodeResult != Wirehair_NeedMore)
        {
            if (decodeResult == Wirehair_Success) {
                break;
            }

            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_decode failed for " << blockId << " and N = " << N << endl;
            return false;
        }
    }

    if (needed >= N + kExtraWarnThreshold) {
        //SIAMESE_DEBUG_BREAK();
        cout << "TestAllRecoveryData: Too much overhead: " << (needed - N) << " extra for N=" << N << " Seed=n/a BlockBytes=" << blockBytes << endl;
        //return false;
    }

    if (!DoesCodecProduceOriginals(decoder, N, blockBytes, finalBytes, message, decodedMessage, messageBytes))
    {
        SIAMESE_DEBUG_BREAK();
        cout << "!! Decoder2 failed to produce originals" << endl;
        return false;
    }

    return true;
}